

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::yml::Parser::_count_nlines(csubstr src)

{
  size_t sVar1;
  char in_stack_0000001f;
  basic_substring<const_char> *in_stack_00000020;
  
  sVar1 = basic_substring<const_char>::count(in_stack_00000020,in_stack_0000001f,src.len);
  return sVar1 + 1;
}

Assistant:

size_t Parser::_count_nlines(csubstr src)
{
    return 1 + src.count('\n');
}